

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

int Vector2Equals(Vector2 p,Vector2 q)

{
  uint uVar1;
  float fVar2;
  undefined4 uStack_14;
  
  fVar2 = fmaxf(ABS(p.x),ABS(q.x));
  if (fVar2 <= 1.0) {
    fVar2 = 1.0;
  }
  uVar1 = 0;
  if (ABS(p.x - q.x) <= fVar2 * 1e-06) {
    uStack_14 = q.y;
    fVar2 = fmaxf(ABS(p.y),ABS(uStack_14));
    if (fVar2 <= 1.0) {
      fVar2 = 1.0;
    }
    uVar1 = (uint)(ABS(p.y - uStack_14) <= fVar2 * 1e-06);
  }
  return uVar1;
}

Assistant:

RMAPI int Vector2Equals(Vector2 p, Vector2 q)
{
#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    int result = ((fabsf(p.x - q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y - q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y)))));

    return result;
}